

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turn.cpp
# Opt level: O2

void __thiscall Turn::Turn(Turn *this,int day,string *skill,ShiftType *shiftType)

{
  uint uVar1;
  
  (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nurses).super__Vector_base<NurseSolution_*,_std::allocator<NurseSolution_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->shiftType = shiftType;
  std::__cxx11::string::string((string *)&this->skill,(string *)skill);
  this->day = day;
  uVar1 = CURRENT_ID + 1;
  this->id = CURRENT_ID;
  CURRENT_ID = uVar1;
  return;
}

Assistant:

Turn::Turn(const int day, const string &skill, const ShiftType *shiftType) : day(day), shiftType(shiftType), skill(skill) {
    id = CURRENT_ID++;
}